

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
detail::sizer::operator()(sizer *this,optional_field<example::exercise_t,_0UL> *param_1)

{
  size_t sVar1;
  undefined8 uVar2;
  ulong uVar3;
  
  if ((this->opts_).super_type.m_initialized != false) {
    if (((this->opts_).super_type.m_storage.dummy_.data[0] & 1U) != 0) {
      sVar1 = (this->buf_).size_;
      uVar3 = (ulong)(sVar1 != 0);
      (this->buf_).data_ = (void *)((long)(this->buf_).data_ + uVar3);
      (this->buf_).size_ = sVar1 - uVar3;
    }
    return;
  }
  uVar2 = __cxa_allocate_exception(0x40);
  bad_message();
  __cxa_throw(uVar2,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

void operator()(example::optional_field<T, N> const&) const {
        if (!opts_)
            throw bad_message();
        if ((*opts_)[N]) {
            T v;
            (*this)(v);
        }
    }